

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O1

void __thiscall implementations::scheme::environment::environment(environment *this,env_p *outer)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->
  super_Environment<std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  ).value.type = Symbol;
  (this->
  super_Environment<std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  ).value.val._M_dataplus._M_p =
       (pointer)&(this->
                 super_Environment<std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                 ).value.val.field_2;
  (this->
  super_Environment<std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  ).value.val._M_string_length = 0;
  (this->
  super_Environment<std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  ).value.val.field_2._M_local_buf[0] = '\0';
  (this->
  super_Environment<std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  ).value.list.
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_Environment<std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  ).value.list.
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_Environment<std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  ).value.list.
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->
  super_Environment<std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  ).value.env.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->
  super_Environment<std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  ).value.env.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = &(this->env_)._M_t._M_impl.super__Rb_tree_header;
  (this->env_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->env_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->env_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->env_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->env_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->outer_).
  super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (outer->super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>)
       ._M_ptr;
  p_Var2 = (outer->
           super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->outer_).
  super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded != '\0') {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      return;
    }
    LOCK();
    p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

environment(env_p outer = nullptr) : outer_(outer) {}